

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O3

string * __thiscall
cpptrace::microfmt::detail::to_string<1,1>
          (string *__return_storage_ptr__,detail *this,uint64_t value,char *digits)

{
  ulong uVar1;
  long lVar2;
  string *number;
  bool bVar3;
  
  if (this == (detail *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0","");
  }
  else {
    uVar1 = 0x3f;
    if (this != (detail *)0x0) {
      for (; (ulong)this >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,'@' - (char)(uVar1 ^ 0x3f));
    lVar2 = 0x3f - (uVar1 ^ 0x3f);
    do {
      (__return_storage_ptr__->_M_dataplus)._M_p[lVar2] = *(char *)(value + ((uint)this & 1));
      lVar2 = lVar2 + -1;
      bVar3 = (detail *)0x1 < this;
      this = (detail *)((ulong)this >> 1);
    } while (bVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(std::uint64_t value, const char* digits = "0123456789abcdef") {
            if(value == 0) {
                return "0";
            } else {
                // digits = floor(1 + log_base(x))
                // log_base(x) = log_2(x) / log_2(base)
                // log_2(x) == 63 - clz(x)
                // 1 + (63 - clz(value)) / (63 - clz(1 << shift))
                // 63 - clz(1 << shift) is the same as shift
                auto n_digits = to<std::size_t>(1 + (63 - clz(value)) / shift);
                std::string number;
                number.resize(n_digits);
                std::size_t i = n_digits - 1;
                while(value > 0) {
                    number[i--] = digits[value & mask];
                    value >>= shift;
                }
                return number;
            }
        }